

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pybind11.h
# Opt level: O1

PyObject * get_dict(PyObject *op,void *param_2)

{
  PyObject *pPVar1;
  long *plVar2;
  long lVar3;
  
  plVar2 = (long *)_PyObject_GetDictPtr();
  if (*plVar2 == 0) {
    lVar3 = PyDict_New();
    *plVar2 = lVar3;
  }
  pPVar1 = (PyObject *)*plVar2;
  if (pPVar1 != (PyObject *)0x0) {
    pPVar1->ob_refcnt = pPVar1->ob_refcnt + 1;
  }
  return pPVar1;
}

Assistant:

inline PyObject *get_dict(PyObject *op, void *) {
    PyObject *&dict = *_PyObject_GetDictPtr(op);
    if (!dict)
        dict = PyDict_New();
    Py_XINCREF(dict);
    return dict;
}